

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Builder<prometheus::Gauge> * prometheus::BuildGauge(void)

{
  Builder<prometheus::Gauge> *in_RDI;
  
  memset(in_RDI,0,0x70);
  detail::Builder<prometheus::Gauge>::Builder(in_RDI);
  return in_RDI;
}

Assistant:

detail::Builder<Gauge> BuildGauge() { return {}; }